

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O0

String * __thiscall
capnp::JsonCodec::encode(String *__return_storage_ptr__,JsonCodec *this,Reader *value,Type type)

{
  StructDataBitCount *this_00;
  Builder output;
  Reader value_00;
  Reader local_218;
  SegmentBuilder *local_1e8;
  SegmentBuilder *pSStack_1e0;
  CapTableBuilder *local_1d8;
  void *pvStack_1d0;
  WirePointer *local_1c8;
  undefined8 local_1b8;
  anon_union_8_2_eba6ea51_for_Type_5 aStack_1b0;
  Reader local_1a0;
  undefined1 auStack_148 [8];
  Builder json;
  MallocMessageBuilder message;
  Reader *value_local;
  JsonCodec *this_local;
  Type type_local;
  
  this_00 = &json._builder.dataSize;
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)this_00,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRoot<capnp::json::Value>((Builder *)auStack_148,(MessageBuilder *)this_00);
  DynamicValue::Reader::Reader(&local_1a0,value);
  local_1c8 = json._builder.pointers;
  local_1d8 = json._builder.capTable;
  pvStack_1d0 = json._builder.data;
  local_1e8 = (SegmentBuilder *)auStack_148;
  pSStack_1e0 = json._builder.segment;
  output._builder.capTable = (CapTableBuilder *)json._builder.segment;
  output._builder.segment = (SegmentBuilder *)auStack_148;
  output._builder.data = json._builder.capTable;
  output._builder.pointers = (WirePointer *)json._builder.data;
  output._builder._32_8_ = json._builder.pointers;
  local_1b8 = type._0_8_;
  aStack_1b0.scopeId = type.field_4.scopeId;
  encode(this,&local_1a0,type,output);
  DynamicValue::Reader::~Reader(&local_1a0);
  capnp::json::Value::Builder::operator_cast_to_Reader(&local_218,(Builder *)auStack_148);
  value_00._reader.capTable = local_218._reader.capTable;
  value_00._reader.segment = local_218._reader.segment;
  value_00._reader.data = local_218._reader.data;
  value_00._reader.pointers = local_218._reader.pointers;
  value_00._reader.dataSize = local_218._reader.dataSize;
  value_00._reader.pointerCount = local_218._reader.pointerCount;
  value_00._reader._38_2_ = local_218._reader._38_2_;
  value_00._reader.nestingLimit = local_218._reader.nestingLimit;
  value_00._reader._44_4_ = local_218._reader._44_4_;
  encodeRaw(__return_storage_ptr__,this,value_00);
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&json._builder.dataSize);
  return __return_storage_ptr__;
}

Assistant:

kj::String JsonCodec::encode(DynamicValue::Reader value, Type type) const {
  MallocMessageBuilder message;
  auto json = message.getRoot<JsonValue>();
  encode(value, type, json);
  return encodeRaw(json);
}